

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_message.cpp
# Opt level: O0

vector<char,_std::allocator<char>_> * __thiscall
file_loader::operator()(file_loader *this,string *name,string *param_3)

{
  byte bVar1;
  char *pcVar2;
  reference pvVar3;
  vector<char,_std::allocator<char>_> *in_RDI;
  undefined1 auVar4 [16];
  size_t len;
  ifstream f;
  vector<char,_std::allocator<char>_> *buffer;
  streamoff in_stack_fffffffffffffd58;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffd70;
  vector<char,_std::allocator<char>_> *__new_size;
  uint7 in_stack_fffffffffffffd90;
  undefined8 local_268;
  undefined8 local_260;
  vector<char,_std::allocator<char>_> *local_258;
  undefined8 local_250;
  fpos<__mbstate_t> *local_248;
  undefined4 local_240;
  long local_230 [65];
  byte local_21;
  
  local_21 = 0;
  __new_size = in_RDI;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x12fec1);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_230,pcVar2,_S_bin);
  bVar1 = std::ios::operator!((ios *)((long)local_230 + *(long *)(local_230[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::istream::seekg((long)local_230,_S_beg);
    auVar4 = std::istream::tellg();
    local_250 = auVar4._8_8_;
    in_stack_fffffffffffffd70 = auVar4._0_8_;
    local_258 = in_stack_fffffffffffffd70;
    local_248 = (fpos<__mbstate_t> *)std::fpos::operator_cast_to_long((fpos *)&local_258);
    if (local_248 != (fpos<__mbstate_t> *)0x0) {
      std::fpos<__mbstate_t>::fpos(local_248,in_stack_fffffffffffffd58);
      std::istream::seekg(local_230,local_268,local_260);
      std::vector<char,_std::allocator<char>_>::resize
                ((vector<char,_std::allocator<char>_> *)(ulong)in_stack_fffffffffffffd90,
                 (size_type)__new_size,(value_type *)in_RDI);
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](in_RDI,0);
      std::istream::read((char *)local_230,(long)pvVar3);
      file_loader_is_actually_called = true;
    }
  }
  local_21 = 1;
  local_240 = 1;
  std::ifstream::~ifstream(local_230);
  if ((local_21 & 1) == 0) {
    std::vector<char,_std::allocator<char>_>::~vector(in_stack_fffffffffffffd70);
  }
  return __new_size;
}

Assistant:

std::vector<char> operator()(std::string const &name,std::string const &/*encoding*/) const
    {
        std::vector<char> buffer;
        std::ifstream f(name.c_str(),std::ifstream::binary);
        if(!f)
            return buffer;
        f.seekg(0,std::ifstream::end);
        size_t len = f.tellg();
        if(len == 0)
            return buffer;
        f.seekg(0);
        buffer.resize(len,'\0');
        f.read(&buffer[0],len);
        file_loader_is_actually_called = true;
        return buffer;
    }